

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Bounds3f * __thiscall
pbrt::AnimatedTransform::BoundPointMotion
          (Bounds3f *__return_storage_ptr__,AnimatedTransform *this,Point3f p)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined8 in_R8;
  int i;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Point3<float> PVar19;
  Point3f PVar20;
  span<float> zeros_00;
  int nZeros;
  Point3<float> local_b8;
  Float local_ac;
  int va;
  float fStack_a4;
  float local_a0;
  DerivativeTerm *local_98;
  DerivativeTerm *local_90;
  DerivativeTerm *local_88;
  DerivativeTerm *local_80;
  DerivativeTerm *local_78;
  unsigned_long vb;
  float fStack_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  Float zeros [8];
  undefined1 auVar11 [64];
  
  local_b8.super_Tuple3<pbrt::Point3,_float>.z = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._8_56_ = p._8_56_;
  auVar8._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_b8.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar8._0_16_);
  if (this->actuallyAnimated == false) {
    PVar19 = Transform::operator()(&this->startTransform,&local_b8);
    auVar12._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar8._8_56_;
    uVar3 = vmovlps_avx(auVar12._0_16_);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
         PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    uVar3 = vmovlps_avx(auVar12._0_16_);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
         PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  }
  else {
    PVar19 = Transform::operator()(&this->startTransform,&local_b8);
    zeros[2] = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar9._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar8._8_56_;
    zeros._0_8_ = vmovlps_avx(auVar9._0_16_);
    PVar19 = Transform::operator()(&this->endTransform,&local_b8);
    fStack_68 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar8._8_56_;
    vb = vmovlps_avx(auVar10._0_16_);
    Bounds3<float>::Bounds3(__return_storage_ptr__,(Point3<float> *)zeros,(Point3<float> *)&vb);
    uVar1._0_4_ = this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar1._4_4_ = this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar1;
    uVar2._0_4_ = this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar2._4_4_ = this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar2;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)&this->R[0].v.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)&this->R[1].v.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_4_ = (float)(undefined4)uVar1 * (float)(undefined4)uVar2;
    auVar16._4_4_ = (float)uVar1._4_4_ * (float)uVar2._4_4_;
    auVar16._8_8_ = 0;
    auVar16 = vmovshdup_avx(auVar16);
    auVar7 = vfmadd231ss_fma(auVar16,auVar7,auVar14);
    auVar16 = vmovshdup_avx(auVar15);
    auVar14 = vfmadd231ss_fma(auVar7,auVar13,auVar15);
    auVar7 = vmovshdup_avx(auVar13);
    auVar16 = vfmadd213ss_fma(auVar16,auVar7,auVar14);
    local_ac = SafeACos(auVar16._0_4_);
    local_80 = this->c2;
    local_88 = this->c3;
    local_78 = this->c1;
    local_90 = this->c4;
    local_98 = this->c5;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      auVar17._8_8_ = 0;
      auVar17._0_4_ = local_b8.super_Tuple3<pbrt::Point3,_float>.x;
      auVar17._4_4_ = local_b8.super_Tuple3<pbrt::Point3,_float>.y;
      nZeros = 0;
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_80[lVar5].kx),auVar17,
                               ZEXT416((uint)local_80[lVar5].kc));
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)local_88[lVar5].kx),auVar17,
                                ZEXT416((uint)local_88[lVar5].kc));
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_78[lVar5].kx),auVar17,
                                ZEXT416((uint)local_78[lVar5].kc));
      auVar16 = vmovshdup_avx(auVar17);
      auVar7 = vfmadd231ss_fma(auVar7,auVar16,ZEXT416((uint)local_80[lVar5].ky));
      auVar14 = vfmadd231ss_fma(auVar14,auVar16,ZEXT416((uint)local_88[lVar5].ky));
      auVar13 = vfmadd231ss_fma(auVar13,auVar16,ZEXT416((uint)local_78[lVar5].ky));
      auVar15 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_b8.super_Tuple3<pbrt::Point3,_float>.z),
                                ZEXT416((uint)local_80[lVar5].kz));
      auVar4 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_b8.super_Tuple3<pbrt::Point3,_float>.z),
                               ZEXT416((uint)local_88[lVar5].kz));
      auVar18 = ZEXT416((uint)local_b8.super_Tuple3<pbrt::Point3,_float>.z);
      auVar13 = vfmadd231ss_fma(auVar13,auVar18,ZEXT416((uint)local_78[lVar5].kz));
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_90[lVar5].kx),auVar17,
                               ZEXT416((uint)local_90[lVar5].kc));
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)local_98[lVar5].kx),auVar17,
                                ZEXT416((uint)local_98[lVar5].kc));
      auVar7 = vfmadd231ss_fma(auVar7,auVar16,ZEXT416((uint)local_90[lVar5].ky));
      auVar16 = vfmadd231ss_fma(auVar14,auVar16,ZEXT416((uint)local_98[lVar5].ky));
      auVar7 = vfmadd231ss_fma(auVar7,auVar18,ZEXT416((uint)local_90[lVar5].kz));
      auVar16 = vfmadd231ss_fma(auVar16,auVar18,ZEXT416((uint)local_98[lVar5].kz));
      zeros_00.n = (size_t)&nZeros;
      zeros_00.ptr = (float *)0x8;
      FindZeros((AnimatedTransform *)zeros,auVar13._0_4_,auVar15._0_4_,auVar4._0_4_,auVar7._0_4_,
                auVar16._0_4_,local_ac,(Interval)0x3f80000000000000,zeros_00,(int *)0x8,(int)in_R8);
      vb = 8;
      va = nZeros;
      if (8 < (uint)nZeros) {
        LogFatal<char_const(&)[7],char_const(&)[49],char_const(&)[7],int&,char_const(&)[49],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform.cpp"
                   ,0x458,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [7])"nZeros",
                   (char (*) [49])"(sizeof(::pbrt::detail::ArraySizeHelper(zeros)))",
                   (char (*) [7])"nZeros",&va,
                   (char (*) [49])"(sizeof(::pbrt::detail::ArraySizeHelper(zeros)))",&vb);
      }
      for (lVar6 = 0; lVar6 < nZeros; lVar6 = lVar6 + 1) {
        PVar20.super_Tuple3<pbrt::Point3,_float>.z = local_b8.super_Tuple3<pbrt::Point3,_float>.z;
        PVar20.super_Tuple3<pbrt::Point3,_float>.x = local_b8.super_Tuple3<pbrt::Point3,_float>.x;
        PVar20.super_Tuple3<pbrt::Point3,_float>.y = local_b8.super_Tuple3<pbrt::Point3,_float>.y;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(zeros[lVar6] * this->endTime)),
                                  ZEXT416((uint)(1.0 - zeros[lVar6])),ZEXT416((uint)this->startTime)
                                 );
        auVar8._8_56_ = ZEXT856(0);
        PVar20 = operator()(this,PVar20,auVar16._0_4_);
        local_a0 = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
        auVar11._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar11._8_56_ = auVar8._8_56_;
        _va = vmovlps_avx(auVar11._0_16_);
        Union<float>((Bounds3<float> *)&vb,__return_storage_ptr__,(Point3<float> *)&va);
        (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y = local_60;
        (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = fStack_5c;
        (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)vb;
        (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y = (float)vb._4_4_;
        *(ulong *)&(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
             CONCAT44(fStack_64,fStack_68);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Bounds3f AnimatedTransform::BoundPointMotion(Point3f p) const {
    if (!actuallyAnimated)
        return Bounds3f(startTransform(p));
    Bounds3f bounds(startTransform(p), endTransform(p));
    Float cosTheta = Dot(R[0], R[1]);
    Float theta = SafeACos(cosTheta);
    for (int c = 0; c < 3; ++c) {
        // Find any motion derivative zeros for the component _c_
        Float zeros[8];
        int nZeros = 0;
        FindZeros(c1[c].Eval(p), c2[c].Eval(p), c3[c].Eval(p), c4[c].Eval(p),
                  c5[c].Eval(p), theta, Interval(0., 1.), zeros, &nZeros);
        CHECK_LE(nZeros, PBRT_ARRAYSIZE(zeros));

        // Expand bounding box for any motion derivative zeros found
        for (int i = 0; i < nZeros; ++i) {
            Point3f pz = (*this)(p, Lerp(zeros[i], startTime, endTime));
            bounds = Union(bounds, pz);
        }
    }
    return bounds;
}